

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O1

int __thiscall jrtplib::RTPUDPv6Transmitter::AbortWait(RTPUDPv6Transmitter *this)

{
  int iVar1;
  
  iVar1 = -0x72;
  if (((this->init == true) && (iVar1 = -0x71, this->created == true)) &&
     (iVar1 = -0x73, this->waitingfordata == true)) {
    RTPAbortDescriptors::SendAbortSignal(this->m_pAbortDesc);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int RTPUDPv6Transmitter::AbortWait()
{
	if (!init)
		return ERR_RTP_UDPV6TRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_NOTCREATED;
	}
	if (!waitingfordata)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_NOTWAITING;
	}

	m_pAbortDesc->SendAbortSignal();
	
	MAINMUTEX_UNLOCK
	return 0;
}